

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O2

string * CreatePacketV0(string *__return_storage_ptr__,string *user_data,size_t padding_size)

{
  pointer pcVar1;
  size_type sVar2;
  int i;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar1[0] = 'R';
  pcVar1[1] = 'N';
  pcVar1[2] = '6';
  pcVar1[3] = 'U';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  StoreBigEndian<unsigned_int>(0x3039,pcVar1 + 9);
  StoreBigEndian<unsigned_int>(0xd431,pcVar1 + 0xd);
  StoreBigEndian<unsigned_long>(0x499602d2,pcVar1 + 0x11);
  sVar2 = user_data->_M_string_length;
  pcVar1[0x19] = (char)(sVar2 >> 8);
  pcVar1[0x1a] = (char)sVar2;
  pcVar1[0x1b] = (char)(padding_size >> 8);
  pcVar1[0x1c] = (char)padding_size;
  for (uVar3 = 0; uVar3 < user_data->_M_string_length; uVar3 = uVar3 + 1) {
    pcVar1[uVar3 + 0x1d] = (user_data->_M_dataplus)._M_p[uVar3];
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CreatePacketV0(const std::string& user_data, size_t padding_size) {
  std::string result;
  result.resize(sizeof(PacketHeaderV0) + user_data.size() + padding_size);

  char* ptr = const_cast<char*>(result.data());
  PacketHeaderV0* packet_header = (PacketHeaderV0*)ptr;
  ptr += sizeof(PacketHeaderV0);

  packet_header->magic[0] = 'R';
  packet_header->magic[1] = 'N';
  packet_header->magic[2] = '6';
  packet_header->magic[3] = 'U';
  packet_header->reserved[0] = 0;
  packet_header->reserved[1] = 0;
  packet_header->reserved[2] = 0;
  packet_header->reserved[3] = 0;
  packet_header->packet_type = udpdiscovery::kPacketIAmHere;
  StoreBigEndian<uint32_t>(kApplicationId, &packet_header->application_id);
  StoreBigEndian<uint32_t>(kPeerId, &packet_header->peer_id);
  StoreBigEndian<uint64_t>(kSnapshotIndex, &packet_header->packet_index);
  StoreBigEndian<uint16_t>(user_data.size(), &packet_header->user_data_size);
  StoreBigEndian<uint16_t>(padding_size, &packet_header->padding_size);

  for (int i = 0; i < user_data.size(); ++i) {
    *ptr = user_data[i];
    ++ptr;
  }

  return result;
}